

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcones2qc.h
# Opt level: O0

Context __thiscall
mp::
QConeConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::Convert(QConeConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
          *this,ItemType *ac,int param_3)

{
  value_type vVar1;
  bool bVar2;
  reference pvVar3;
  FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *c_00;
  iterator this_00;
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_> *this_01;
  long in_RSI;
  BasicItemConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_RDI;
  QuadTerms *this_02;
  double dVar4;
  NodeRange NVar5;
  QuadConLE qc_1;
  Arguments x0;
  double rhs;
  QuadConLE qc;
  double *coef;
  iterator __end2;
  iterator __begin2;
  Parameters *__range2;
  Parameters c;
  Arguments *x;
  undefined4 in_stack_ffffffffffffeff8;
  int in_stack_ffffffffffffeffc;
  FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_fffffffffffff000;
  NodeIndexRange in_stack_fffffffffffff010;
  const_iterator in_stack_fffffffffffff018;
  undefined1 fSort;
  QuadAndLinTerms *in_stack_fffffffffffff020;
  QuadAndLinTerms *this_03;
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_> *in_stack_fffffffffffff028;
  AlgConRhs<_1> in_stack_fffffffffffff030;
  AlgConRhs<_1> rr;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffff038;
  QuadTerms *in_stack_fffffffffffff040;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffff048;
  vector<double,_std::allocator<double>_> *this_04;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffff050;
  double in_stack_fffffffffffff0a8;
  double in_stack_fffffffffffff0b0;
  int in_stack_fffffffffffff0bc;
  FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_fffffffffffff0c0;
  AlgConRhs<_1> local_d70 [41];
  undefined8 local_c28;
  undefined8 uStack_c20;
  undefined8 local_c18;
  undefined8 uStack_c10;
  undefined8 local_c08;
  undefined8 uStack_c00;
  undefined8 local_bf8;
  undefined8 uStack_bf0;
  undefined8 local_be8;
  undefined8 uStack_be0;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  undefined8 local_bc8;
  undefined8 uStack_bc0;
  undefined8 local_bb8;
  int *local_810;
  int *local_808;
  undefined1 local_7f8 [64];
  type local_7b8;
  AlgConRhs<_1> local_5d0 [41];
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  reference local_60;
  double *local_58;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_50;
  vector<double,_std::allocator<double>_> *local_48;
  vector<double,_std::allocator<double>_> local_40;
  Arguments *local_28;
  long local_18;
  Context local_4;
  
  local_18 = in_RSI;
  local_28 = CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::QuadraticConeId>
             ::GetArguments((CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::QuadraticConeId>
                             *)(in_RSI + 0x20));
  CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::QuadraticConeId>
  ::GetParameters((CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::QuadraticConeId>
                   *)(local_18 + 0x20));
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffff050,in_stack_fffffffffffff048);
  local_48 = &local_40;
  local_50._M_current =
       (double *)
       std::vector<double,_std::allocator<double>_>::begin
                 ((vector<double,_std::allocator<double>_> *)
                  CONCAT44(in_stack_ffffffffffffeffc,in_stack_ffffffffffffeff8));
  local_58 = (double *)
             std::vector<double,_std::allocator<double>_>::end
                       ((vector<double,_std::allocator<double>_> *)
                        CONCAT44(in_stack_ffffffffffffeffc,in_stack_ffffffffffffeff8));
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *
                       )in_stack_fffffffffffff000,
                       (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *
                       )CONCAT44(in_stack_ffffffffffffeffc,in_stack_ffffffffffffeff8));
    if (!bVar2) break;
    local_60 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator*(&local_50);
    *local_60 = *local_60 * *local_60;
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&local_50);
  }
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&local_40,0);
  vVar1 = *pvVar3;
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&local_40,0);
  *pvVar3 = -vVar1;
  BasicItemConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::GetMC(in_RDI);
  std::vector<int,_std::allocator<int>_>::operator[](local_28,0);
  bVar2 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
          ::is_fixed(in_stack_fffffffffffff000,in_stack_ffffffffffffeffc);
  if (bVar2) {
    rr.rhs_ = 0.0;
    this_04 = &local_40;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](this_04,0);
    this_02 = (QuadTerms *)((ulong)*pvVar3 ^ 0x8000000000000000);
    c_00 = BasicItemConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           ::GetMC(in_RDI);
    std::vector<int,_std::allocator<int>_>::operator[](local_28,(size_type)rr.rhs_);
    dVar4 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
            ::fixed_value(in_stack_fffffffffffff000,in_stack_ffffffffffffeffc);
    local_7f8._48_8_ = (double)this_02 * dVar4;
    local_7f8._32_8_ =
         std::vector<double,_std::allocator<double>_>::begin
                   ((vector<double,_std::allocator<double>_> *)
                    CONCAT44(in_stack_ffffffffffffeffc,in_stack_ffffffffffffeff8));
    __gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>::
    __normal_iterator<double*>
              ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> *)
               in_stack_fffffffffffff000,
               (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
               CONCAT44(in_stack_ffffffffffffeffc,in_stack_ffffffffffffeff8));
    local_7f8._24_8_ =
         std::vector<double,_std::allocator<double>_>::erase
                   ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff010,
                    in_stack_fffffffffffff018);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_7f8._24_8_,
               (vector<int,_std::allocator<int>_> *)this_04);
    this_03 = (QuadAndLinTerms *)local_7f8;
    local_808 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                 ((vector<int,_std::allocator<int>_> *)
                                  CONCAT44(in_stack_ffffffffffffeffc,in_stack_ffffffffffffeff8));
    __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
    __normal_iterator<int*>
              ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
               in_stack_fffffffffffff000,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
               CONCAT44(in_stack_ffffffffffffeffc,in_stack_ffffffffffffeff8));
    this_00 = std::vector<int,_std::allocator<int>_>::erase
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff010,
                         (const_iterator)in_stack_fffffffffffff018._M_current);
    local_bc8 = 0;
    uStack_bc0 = 0;
    local_bd8 = 0;
    uStack_bd0 = 0;
    local_be8 = 0;
    uStack_be0 = 0;
    local_bf8 = 0;
    uStack_bf0 = 0;
    local_c08 = 0;
    uStack_c00 = 0;
    local_c18 = 0;
    uStack_c10 = 0;
    local_c28 = 0;
    uStack_c20 = 0;
    local_bb8 = 0;
    local_810 = this_00._M_current;
    LinTerms::LinTerms((LinTerms *)in_stack_fffffffffffff000);
    QuadTerms::QuadTerms
              (this_02,(vector<double,_std::allocator<double>_> *)c_00,
               (vector<int,_std::allocator<int>_> *)rr.rhs_,
               (vector<int,_std::allocator<int>_> *)this_00._M_current);
    QuadAndLinTerms::QuadAndLinTerms
              (this_03,(LinTerms *)in_stack_fffffffffffff018._M_current,
               (QuadTerms *)in_stack_fffffffffffff010);
    fSort = (undefined1)((ulong)in_stack_fffffffffffff018._M_current >> 0x38);
    AlgConRhs<-1>::AlgConRhs(local_d70,(double)local_7f8._48_8_);
    AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>::AlgebraicConstraint
              ((AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_> *)this_00._M_current,
               this_03,rr,(bool)fSort);
    QuadAndLinTerms::~QuadAndLinTerms((QuadAndLinTerms *)in_stack_fffffffffffff000);
    QuadTerms::~QuadTerms((QuadTerms *)in_stack_fffffffffffff000);
    LinTerms::~LinTerms((LinTerms *)in_stack_fffffffffffff000);
    this_01 = (AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_> *)
              BasicItemConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
              ::GetMC(in_RDI);
    AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>::AlgebraicConstraint
              (this_01,(AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_> *)
                       CONCAT44(in_stack_ffffffffffffeffc,in_stack_ffffffffffffeff8));
    NVar5 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>
            ::AddConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<_1>>>
                      ((FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                        *)rr.rhs_,
                       (AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_> *)
                       this_00._M_current);
    AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>::~AlgebraicConstraint(this_01);
    AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>::~AlgebraicConstraint(this_01);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)NVar5.ir_);
  }
  else {
    BasicItemConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::GetMC(in_RDI);
    std::vector<int,_std::allocator<int>_>::operator[](local_28,0);
    BasicItemConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::GetMC(in_RDI);
    BasicFlatConverter::Infty();
    FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
    ::NarrowVarBounds(in_stack_fffffffffffff0c0,in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b0,
                      in_stack_fffffffffffff0a8);
    local_428 = 0;
    uStack_420 = 0;
    local_438 = 0;
    uStack_430 = 0;
    local_448 = 0;
    uStack_440 = 0;
    local_458 = 0;
    uStack_450 = 0;
    local_468 = 0;
    uStack_460 = 0;
    local_478 = 0;
    uStack_470 = 0;
    local_488 = 0;
    uStack_480 = 0;
    local_418 = 0;
    LinTerms::LinTerms((LinTerms *)in_stack_fffffffffffff000);
    QuadTerms::QuadTerms
              (in_stack_fffffffffffff040,in_stack_fffffffffffff038,
               (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff030.rhs_,
               (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff028);
    QuadAndLinTerms::QuadAndLinTerms
              (in_stack_fffffffffffff020,(LinTerms *)in_stack_fffffffffffff018._M_current,
               (QuadTerms *)in_stack_fffffffffffff010);
    AlgConRhs<-1>::AlgConRhs(local_5d0,0.0);
    AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>::AlgebraicConstraint
              (in_stack_fffffffffffff028,in_stack_fffffffffffff020,in_stack_fffffffffffff030,
               SUB81((ulong)in_stack_fffffffffffff018._M_current >> 0x38,0));
    QuadAndLinTerms::~QuadAndLinTerms((QuadAndLinTerms *)in_stack_fffffffffffff000);
    QuadTerms::~QuadTerms((QuadTerms *)in_stack_fffffffffffff000);
    LinTerms::~LinTerms((LinTerms *)in_stack_fffffffffffff000);
    BasicItemConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::GetMC(in_RDI);
    AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>::AlgebraicConstraint
              ((AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_> *)
               in_stack_fffffffffffff000,
               (AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_> *)
               CONCAT44(in_stack_ffffffffffffeffc,in_stack_ffffffffffffeff8));
    join_0x00000010_0x00000000_ =
         FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>
         ::AddConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<_1>>>
                   ((FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                     *)in_stack_fffffffffffff030.rhs_,in_stack_fffffffffffff028);
    AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>::~AlgebraicConstraint
              ((AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_> *)
               in_stack_fffffffffffff000);
    AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>::~AlgebraicConstraint
              ((AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_> *)
               in_stack_fffffffffffff000);
    NVar5.ir_ = in_stack_fffffffffffff010;
    NVar5.pvn_ = (ValueNode *)in_stack_fffffffffffff018._M_current;
  }
  Context::Context(&local_4,CTX_ROOT);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)NVar5.ir_);
  return (Context)local_4.value_;
}

Assistant:

Context Convert(const ItemType& ac, int ) {
    const auto& x = ac.GetArguments();
    auto c = ac.GetParameters();
    for (auto& coef: c)
      coef *= coef;
    c[0] = -c[0];
    if (!GetMC().is_fixed(x[0])) {
      GetMC().NarrowVarBounds(x[0], 0.0, GetMC().Infty());
      auto qc {QuadConLE{ {{}, {c, x, x}}, {0.0} }};
      GetMC().AddConstraint(std::move(qc));
    } else {
      // Reproduce fixed RHS, better for Mosek & COPT. conic/socp_10
      auto rhs = -c[0] * GetMC().fixed_value(x[0]);
      c.erase(c.begin());
      auto x0 = x;
      x0.erase(x0.begin());
      auto qc {QuadConLE{ {{}, {c, x0, x0}}, {rhs} }};
      GetMC().AddConstraint(std::move(qc));
    }
    return Context::CTX_ROOT;
  }